

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

BTLeafNode * __thiscall
storage::BTLeafNode::insert_(BTLeafNode *this,int key,Record *record,bool *out)

{
  bool bVar1;
  BTLeafNode *pBVar2;
  int local_40;
  int local_3c;
  int i;
  int index;
  Record *a;
  bool *out_local;
  Record *record_local;
  BTLeafNode *pBStack_18;
  int key_local;
  BTLeafNode *this_local;
  
  *out = true;
  _i = (Record *)0x0;
  local_3c = -1;
  a = out;
  out_local = (bool *)record;
  record_local._4_4_ = key;
  pBStack_18 = this;
  bVar1 = search_record(this,key,(Record **)&i,&local_3c);
  if (bVar1) {
    *(undefined1 *)a = 0;
  }
  else {
    bVar1 = BTNode::full(&this->super_BTNode);
    if (bVar1) {
      pBVar2 = split(this,record_local._4_4_,out_local);
      return pBVar2;
    }
    for (local_40 = (this->super_BTNode).used_links_count_ + -2;
        (-1 < local_40 && (record_local._4_4_ < (this->super_BTNode).keys_[local_40]));
        local_40 = local_40 + -1) {
      (this->super_BTNode).keys_[local_40 + 1] = (this->super_BTNode).keys_[local_40];
      this->record_links_[local_40 + 1] = this->record_links_[local_40];
    }
    (this->super_BTNode).keys_[local_40 + 1] = record_local._4_4_;
    this->record_links_[local_40 + 1] = out_local;
    (this->super_BTNode).used_links_count_ = (this->super_BTNode).used_links_count_ + 1;
  }
  return (BTLeafNode *)0x0;
}

Assistant:

BTLeafNode *BTLeafNode::insert_(int key, Record *record, bool &out) {
        out = true;
        Record *a = nullptr;
        int index = -1;
        if (!search_record(key, a, index)) {
            if (!full()) {
                int i = 0;
                for (i = used_links_count_ - 2; i >= 0; --i) {
                    if (keys_[i] > key) {
                        keys_[i + 1] = keys_[i];
                        record_links_[i + 1] = record_links_[i];
                    } else {
                        break;
                    }
                }
                keys_[i + 1] = key;
                record_links_[i + 1] = record;
                used_links_count_++;
            } else {
                return split(key, record);
            }
        } else {
            out = false;
        }
        return nullptr;
    }